

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
container_from_run_range(run_container_t *run,uint32_t min,uint32_t max,uint8_t *typecode_after)

{
  ushort uVar1;
  rle16_t *prVar2;
  uint64_t *puVar3;
  array_container_t *bits;
  array_container_t *paVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  uint32_t firstword;
  uint uVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  
  bits = (array_container_t *)bitset_container_create();
  *typecode_after = '\x01';
  iVar13 = run->n_runs;
  if ((long)iVar13 < 1) {
    iVar14 = 0;
  }
  else {
    prVar2 = run->runs;
    puVar3 = (uint64_t *)bits->array;
    lVar16 = 0;
    iVar14 = 0;
    do {
      uVar1 = prVar2[lVar16].value;
      uVar12 = (uint)prVar2[lVar16].length + (uint)uVar1;
      uVar8 = (uint)(uVar1 >> 6);
      uVar10 = uVar12 >> 6;
      if (uVar10 - uVar8 == 0) {
        puVar3[uVar8] =
             puVar3[uVar8] |
             (0xffffffffffffffffU >> (0x3fU - (char)prVar2[lVar16].length & 0x3f)) <<
             ((byte)uVar1 & 0x3f);
      }
      else {
        uVar11 = puVar3[uVar10];
        puVar3[uVar8] = puVar3[uVar8] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar8 + 1 < uVar10) {
          memset(puVar3 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar10 - uVar8) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar3[uVar10] = uVar11 | 0xffffffffffffffffU >> (~(byte)uVar12 & 0x3f);
      }
      iVar14 = iVar14 + (uint)prVar2[lVar16].length + 1;
      lVar16 = lVar16 + 1;
    } while (iVar13 != lVar16);
  }
  puVar3 = (uint64_t *)bits->array;
  uVar8 = min >> 6;
  uVar10 = max >> 6;
  cVar9 = (char)(max - min);
  bVar5 = (byte)min;
  if (uVar10 == uVar8) {
    uVar11 = puVar3[uVar8] & (0xffffffffffffffffU >> (0x3fU - cVar9 & 0x3f)) << (bVar5 & 0x3f);
    uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
    uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
    uVar12 = (uint)(byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  else {
    uVar11 = (puVar3[uVar8] >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
    uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
    uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
    uVar11 = ((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
    uVar7 = uVar11 >> 0x38;
    uVar12 = (uint)(byte)(uVar11 >> 0x38);
    if (uVar8 + 1 < uVar10) {
      uVar11 = (ulong)(uVar8 + 1);
      do {
        uVar15 = puVar3[uVar11] - (puVar3[uVar11] >> 1 & 0x5555555555555555);
        uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
        uVar12 = (int)uVar7 +
                 (uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38);
        uVar7 = (ulong)uVar12;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    bVar6 = ~(byte)max;
    uVar11 = (puVar3[uVar10] << (bVar6 & 0x3f)) >> (bVar6 & 0x3f);
    uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
    uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
    uVar12 = (byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
             uVar12;
  }
  iVar13 = ((max - min) + iVar14 + 1) - uVar12;
  if (uVar10 - uVar8 == 0) {
    puVar3[uVar8] =
         puVar3[uVar8] | (0xffffffffffffffffU >> (0x3fU - cVar9 & 0x3f)) << (bVar5 & 0x3f);
  }
  else {
    uVar11 = puVar3[uVar10];
    puVar3[uVar8] = puVar3[uVar8] | -1L << (bVar5 & 0x3f);
    if (uVar8 + 1 < uVar10) {
      memset(puVar3 + (ulong)uVar8 + 1,0xff,(ulong)((uVar10 - uVar8) - 2 >> 1) * 0x10 + 0x10);
    }
    puVar3[uVar10] = uVar11 | 0xffffffffffffffffU >> (~(byte)max & 0x3f);
  }
  bits->cardinality = iVar13;
  paVar4 = bits;
  if (iVar13 < 0x1001) {
    paVar4 = array_container_from_bitset((bitset_container_t *)bits);
    *typecode_after = '\x02';
    bitset_container_free((bitset_container_t *)bits);
  }
  return paVar4;
}

Assistant:

container_t *container_from_run_range(
    const run_container_t *run,
    uint32_t min, uint32_t max, uint8_t *typecode_after
){
    // We expect most of the time to end up with a bitset container
    bitset_container_t *bitset = bitset_container_create();
    *typecode_after = BITSET_CONTAINER_TYPE;
    int32_t union_cardinality = 0;
    for (int32_t i = 0; i < run->n_runs; ++i) {
        uint32_t rle_min = run->runs[i].value;
        uint32_t rle_max = rle_min + run->runs[i].length;
        bitset_set_lenrange(bitset->words, rle_min, rle_max - rle_min);
        union_cardinality += run->runs[i].length + 1;
    }
    union_cardinality += max - min + 1;
    union_cardinality -= bitset_lenrange_cardinality(bitset->words, min, max-min);
    bitset_set_lenrange(bitset->words, min, max - min);
    bitset->cardinality = union_cardinality;
    if(bitset->cardinality <= DEFAULT_MAX_SIZE) {
        // we need to convert to an array container
        array_container_t * array = array_container_from_bitset(bitset);
        *typecode_after = ARRAY_CONTAINER_TYPE;
        bitset_container_free(bitset);
        return array;
    }
    return bitset;
}